

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkFunctionalIso(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int Result;
  Abc_Ntk_t *pNtkNew;
  int fCommon_local;
  int iCo2_local;
  int iCo1_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
    pNtk_local._4_4_ = Abc_NtkFunctionalIsoInt(pNtk_00,iCo1,iCo2,fCommon);
    Abc_NtkDelete(pNtk_00);
  }
  else {
    pNtk_local._4_4_ = Abc_NtkFunctionalIsoInt(pNtk,iCo1,iCo2,fCommon);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkFunctionalIso( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Abc_Ntk_t * pNtkNew; int Result;
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkFunctionalIsoInt( pNtk, iCo1, iCo2, fCommon );
    pNtkNew = Abc_NtkStrash( pNtk, 0, 0, 0 );
    Result = Abc_NtkFunctionalIsoInt( pNtkNew, iCo1, iCo2, fCommon );
    Abc_NtkDelete( pNtkNew );
    return Result;
}